

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  cmState *this_00;
  char *pcVar4;
  _Alloc_hider _Var5;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  if (key == (char *)0x0) {
    pcVar4 = ExpandVariable(this,var);
    return pcVar4;
  }
  if (var == (char *)0x0) {
    return this->EmptyVariable;
  }
  iVar2 = strcmp(key,"ENV");
  if (iVar2 == 0) {
    pcVar4 = getenv(var);
    if (pcVar4 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes != true) {
      return pcVar4;
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    sVar3 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar4,pcVar4 + sVar3);
    cmSystemTools::EscapeQuotes((string *)local_198,&local_1b8);
    pcVar4 = AddString(this,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
LAB_003ca0ae:
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  else {
    iVar2 = strcmp(key,"CACHE");
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Syntax $",8);
      sVar3 = strlen(key);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,key,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"{} is not supported.  ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Only ${}, $ENV{}, and $CACHE{} are allowed.",0x2b);
      std::__cxx11::stringbuf::str();
      if ((this->ErrorString)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ErrorString);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_198 + 0x10);
    local_198._0_8_ = paVar1;
    sVar3 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,var,var + sVar3);
    pcVar4 = cmState::GetInitializedCacheValue(this_00,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar1) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if (pcVar4 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes != true) {
      local_198._0_8_ = paVar1;
      sVar3 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar4,pcVar4 + sVar3);
      pcVar4 = AddString(this,(string *)local_198);
      local_1b8.field_2._M_allocated_capacity = local_198._16_8_;
      _Var5._M_p = (pointer)local_198._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ == paVar1) {
        return pcVar4;
      }
      goto LAB_003ca1d1;
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    sVar3 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar4,pcVar4 + sVar3);
    cmSystemTools::EscapeQuotes((string *)local_198,&local_1b8);
    pcVar4 = AddString(this,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar1) goto LAB_003ca0ae;
  }
  _Var5._M_p = local_1b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
    return pcVar4;
  }
LAB_003ca1d1:
  operator_delete(_Var5._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  return pcVar4;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if ( !key )
    {
    return this->ExpandVariable(var);
    }
  if(!var)
    {
    return this->EmptyVariable;
    }
  if ( strcmp(key, "ENV") == 0 )
    {
    char *ptr = getenv(var);
    if (ptr)
      {
      if (this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(ptr));
        }
      else
        {
        return ptr;
        }
      }
    return this->EmptyVariable;
    }
  if ( strcmp(key, "CACHE") == 0 )
    {
    if(const char* c = this->Makefile->GetState()
                           ->GetInitializedCacheValue(var))
      {
      if(this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
        }
      else
        {
        return this->AddString(c);
        }
      }
    return this->EmptyVariable;
    }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return 0;
}